

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

d_flags restore_d_flags(memfile *mf)

{
  byte bVar1;
  int32_t iVar2;
  uint dflags;
  memfile *mf_local;
  d_flags f;
  
  iVar2 = mread32(mf);
  bVar1 = (byte)((uint)iVar2 >> 0x18);
  mf_local._4_4_ =
       (d_flags)CONCAT31(mf_local._5_3_,
                         mf_local._4_1_ & 0x80 | bVar1 >> 7 | (bVar1 >> 6 & 1) << 1 |
                         (bVar1 >> 5 & 1) << 2 | (bVar1 >> 4 & 1) << 3 | (bVar1 >> 1 & 7) << 4);
  return mf_local._4_4_;
}

Assistant:

d_flags restore_d_flags(struct memfile *mf)
{
    unsigned int dflags;
    d_flags f;
    
    dflags = mread32(mf);
    f.town = (dflags >> 31) & 1;
    f.hellish = (dflags >> 30) & 1;
    f.maze_like = (dflags >> 29) & 1;
    f.rogue_like = (dflags >> 28) & 1;
    f.align = (dflags >> 25) & 7;
    
    return f;
}